

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdl_interface.c
# Opt level: O0

_Bool init_SDL(void)

{
  undefined8 uVar1;
  _Bool _Var2;
  int iVar3;
  _Bool local_9;
  
  iVar3 = SDL_Init(0xf231);
  if (iVar3 < 0) {
    uVar1 = SDL_GetError();
    printf("ERROR: SDL failed to init: %s\n",uVar1);
    local_9 = true;
  }
  else {
    screen = (SDL_Window *)
             SDL_CreateWindow("NES EMU by Fisherman166",0x1fff0000,0x1fff0000,0x280,0x1e0,2);
    if (screen == (SDL_Window *)0x0) {
      uVar1 = SDL_GetError();
      printf("ERROR: Failed to create SDL WINDOW %s\n",uVar1);
      local_9 = true;
    }
    else {
      renderer = (SDL_Renderer *)SDL_CreateRenderer(screen,0xffffffff,2);
      if (renderer == (SDL_Renderer *)0x0) {
        uVar1 = SDL_GetError();
        printf("ERROR: %s\n",uVar1);
        local_9 = true;
      }
      else {
        _Var2 = clear_renderer(renderer);
        if (_Var2) {
          local_9 = true;
        }
        else {
          iVar3 = SDL_SetHint("SDL_RENDER_SCALE_QUALITY","linear");
          if (iVar3 == 0) {
            uVar1 = SDL_GetError();
            printf("ERROR: HINT: %s\n",uVar1);
            local_9 = true;
          }
          else {
            iVar3 = SDL_RenderSetLogicalSize(renderer,0x100,0xf0);
            if (iVar3 == 0) {
              texture = (SDL_Texture *)SDL_CreateTexture(renderer,0x16362004,1,0x100,0xf0);
              if (texture == (SDL_Texture *)0x0) {
                uVar1 = SDL_GetError();
                printf("ERROR: Texture creation: %s\n",uVar1);
                local_9 = true;
              }
              else {
                local_9 = false;
              }
            }
            else {
              uVar1 = SDL_GetError();
              printf("ERROR: Set Logical Size: %s\n",uVar1);
              local_9 = true;
            }
          }
        }
      }
    }
  }
  return local_9;
}

Assistant:

bool init_SDL() {
    if( SDL_Init(SDL_INIT_EVERYTHING) < 0 ) {
        printf("ERROR: SDL failed to init: %s\n", SDL_GetError());
        return true;
    }

    screen = SDL_CreateWindow("NES EMU by Fisherman166",
                              SDL_WINDOWPOS_UNDEFINED,
                              SDL_WINDOWPOS_UNDEFINED,
                              640, 480,
                              SDL_WINDOW_OPENGL);
    if(screen == NULL) {
        printf("ERROR: Failed to create SDL WINDOW %s\n", SDL_GetError());
        return true;
    }

    // Renderer stuff
    renderer = SDL_CreateRenderer(screen, -1, SDL_RENDERER_ACCELERATED);
    if(renderer == NULL) {
        printf("ERROR: %s\n", SDL_GetError());
        return true;
    }
    if(clear_renderer(renderer)) return true;

    if(SDL_SetHint(SDL_HINT_RENDER_SCALE_QUALITY, "linear") == SDL_FALSE) {
        printf("ERROR: HINT: %s\n", SDL_GetError());
        return true;
    }
    if(SDL_RenderSetLogicalSize(renderer, SCREEN_WIDTH, SCREEN_HEIGHT)) {
        printf("ERROR: Set Logical Size: %s\n", SDL_GetError());
        return true;
    }

    texture = SDL_CreateTexture(
        renderer,
        SDL_PIXELFORMAT_ARGB8888,
        SDL_TEXTUREACCESS_STREAMING,
        SCREEN_WIDTH, SCREEN_HEIGHT);
    if(texture == NULL) {
        printf("ERROR: Texture creation: %s\n", SDL_GetError());
        return true;
    }

    return false;
}